

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

PortInfo kratos::InlineGeneratorVisitor::get_port_assignment(Port *port)

{
  bool bVar1;
  int iVar2;
  PortDirection PVar3;
  undefined4 extraout_var;
  Generator *pGVar4;
  undefined4 extraout_var_00;
  __shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  Var **ppVVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  PortInfo PVar8;
  value_type *stmt_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range3_1;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sinks;
  value_type *stmt;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range3;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sources;
  Generator *gen_parent;
  Port *port_local;
  PortInfo info;
  
  PVar8.direction = Port::port_direction(port);
  info.direction = In;
  info._4_4_ = 0;
  iVar2 = (*(port->super_Var).super_IRNode._vptr_IRNode[0xd])();
  pGVar4 = Generator::parent_generator((Generator *)CONCAT44(extraout_var,iVar2));
  PVar3 = Port::port_direction(port);
  if (PVar3 == In) {
    iVar2 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x10])();
    __end3 = std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)CONCAT44(extraout_var_00,iVar2));
    stmt = (value_type *)
           std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                  *)CONCAT44(extraout_var_00,iVar2));
    while (bVar1 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                              ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)
                               &stmt), bVar1) {
      p_Var5 = &std::__detail::
                _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                          (&__end3)->
                super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
      peVar6 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p_Var5);
      ppVVar7 = AssignStmt::left(peVar6);
      if ((Port *)*ppVVar7 == port) {
        peVar6 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)p_Var5);
        iVar2 = (*(peVar6->super_Stmt).super_IRNode._vptr_IRNode[4])();
        if ((Generator *)CONCAT44(extraout_var_01,iVar2) == pGVar4) {
          if (info._0_8_ != 0) {
            info.direction = In;
            info._4_4_ = 0;
            break;
          }
          info._0_8_ = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get
                                 (p_Var5);
        }
      }
      std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
      operator++(&__end3);
    }
  }
  else {
    iVar2 = (*(port->super_Var).super_IRNode._vptr_IRNode[0xe])();
    __end3_1 = std::
               unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                        *)CONCAT44(extraout_var_02,iVar2));
    stmt_1 = (value_type *)
             std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)CONCAT44(extraout_var_02,iVar2));
    while (bVar1 = std::__detail::operator!=
                             (&__end3_1.
                               super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                              ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)
                               &stmt_1), bVar1) {
      p_Var5 = &std::__detail::
                _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                          (&__end3_1)->
                super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
      peVar6 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p_Var5);
      ppVVar7 = AssignStmt::right(peVar6);
      if ((Port *)*ppVVar7 == port) {
        peVar6 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)p_Var5);
        iVar2 = (*(peVar6->super_Stmt).super_IRNode._vptr_IRNode[4])();
        if ((Generator *)CONCAT44(extraout_var_03,iVar2) == pGVar4) {
          if (info._0_8_ != 0) {
            info.direction = In;
            info._4_4_ = 0;
            break;
          }
          info._0_8_ = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get
                                 (p_Var5);
        }
      }
      std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
      operator++(&__end3_1);
    }
  }
  PVar8._4_4_ = 0;
  PVar8.stmt = (AssignStmt *)info._0_8_;
  return PVar8;
}

Assistant:

static PortInfo get_port_assignment(Port* port) {
        PortInfo info{port->port_direction(), nullptr};
        auto* gen_parent = port->generator()->parent_generator();
        if (port->port_direction() == PortDirection::In) {
            // assume we have handled the port decouple
            auto const& sources = port->sources();
            for (auto const& stmt : sources) {
                if (stmt->left() == port && stmt->parent() == gen_parent) {
                    if (info.stmt) {
                        // illegal state, return nothing just to be safe
                        info.stmt = nullptr;
                        return info;
                    }
                    info.stmt = stmt.get();
                }
            }
        } else {
            auto const& sinks = port->sinks();
            for (auto const& stmt : sinks) {
                if (stmt->right() == port && stmt->parent() == gen_parent) {
                    if (info.stmt) {
                        // illegal state, return nothing just to be safe
                        info.stmt = nullptr;
                        return info;
                    }
                    info.stmt = stmt.get();
                }
            }
        }
        return info;
    }